

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

USTATUS __thiscall FfsParser::parseVersionSectionBody(FfsParser *this,UModelIndex *index)

{
  TreeModel *this_00;
  bool bVar1;
  CBString local_80;
  CBString local_68;
  CBString local_50;
  UByteArray local_38;
  
  bVar1 = UModelIndex::isValid(index);
  if (bVar1) {
    this_00 = this->model;
    Bstrlib::CBString::CBString(&local_68,"\nVersion string: ");
    TreeModel::body(&local_38,this->model,index);
    uFromUcs2(&local_80,local_38.d._M_dataplus._M_p,0);
    Bstrlib::CBString::operator+(&local_50,&local_68,&local_80);
    TreeModel::addInfo(this_00,index,&local_50,true);
    Bstrlib::CBString::~CBString(&local_50);
    Bstrlib::CBString::~CBString(&local_80);
    std::__cxx11::string::~string((string *)&local_38);
    Bstrlib::CBString::~CBString(&local_68);
  }
  return (ulong)!bVar1;
}

Assistant:

USTATUS FfsParser::parseVersionSectionBody(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return U_INVALID_PARAMETER;
    
    // Add info
    model->addInfo(index, UString("\nVersion string: ") + uFromUcs2(model->body(index).constData()));
    
    return U_SUCCESS;
}